

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nesintf.c
# Opt level: O0

void nes_set_chip_option_mame(void *chip,UINT32 NesOptions)

{
  NESAPU_INF *info;
  UINT32 NesOptions_local;
  void *chip_local;
  
  nesapu_set_options(*(void **)((long)chip + 8),NesOptions);
  if (*(long *)((long)chip + 0x18) != 0) {
    nes_set_chip_option_fds((NESAPU_INF *)chip,NesOptions);
  }
  return;
}

Assistant:

static void nes_set_chip_option_mame(void* chip, UINT32 NesOptions)
{
	NESAPU_INF* info = (NESAPU_INF*)chip;
	
	nesapu_set_options(info->chip_apu, NesOptions);
	
#ifdef EC_NES_NSFP_FDS
	if (info->chip_fds != NULL)
		nes_set_chip_option_fds(info, NesOptions);
#endif
	
	return;
}